

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O1

QString * QLibraryInfoPrivate::path
                    (QString *__return_storage_ptr__,LibraryPath p,UsageMode usageMode)

{
  Data *pDVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  paths((QStringList *)&local_30,p,usageMode);
  if (local_30.size == 0) {
    pDVar1 = (Data *)0x0;
  }
  else {
    pDVar1 = ((local_30.ptr)->d).d;
  }
  (__return_storage_ptr__->d).d = pDVar1;
  if (local_30.size == 0) {
    pcVar3 = (char16_t *)0x0;
  }
  else {
    pcVar3 = ((local_30.ptr)->d).ptr;
  }
  (__return_storage_ptr__->d).ptr = pcVar3;
  if (local_30.size == 0) {
    qVar2 = 0;
  }
  else {
    qVar2 = ((local_30.ptr)->d).size;
  }
  (__return_storage_ptr__->d).size = qVar2;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLibraryInfoPrivate::path(QLibraryInfo::LibraryPath p, UsageMode usageMode)
{
    return paths(p, usageMode).value(0, QString());
}